

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void des3_set3key(uint32_t *esk,uint32_t *dsk,uchar *key)

{
  long lVar1;
  ulong uVar2;
  
  mbedtls_des_setkey(esk,key);
  mbedtls_des_setkey(dsk + 0x20,key + 8);
  mbedtls_des_setkey(esk + 0x40,key + 0x10);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < 0x20; uVar2 = uVar2 + 2) {
    dsk[uVar2] = *(uint32_t *)((long)esk + lVar1 + 0x178);
    dsk[uVar2 + 1] = *(uint32_t *)((long)esk + lVar1 + 0x17c);
    esk[uVar2 + 0x20] = *(uint32_t *)((long)dsk + lVar1 + 0xf8);
    esk[uVar2 + 0x21] = *(uint32_t *)((long)dsk + lVar1 + 0xfc);
    dsk[uVar2 + 0x40] = *(uint32_t *)((long)esk + lVar1 + 0x78);
    dsk[uVar2 + 0x41] = *(uint32_t *)((long)esk + lVar1 + 0x7c);
    lVar1 = lVar1 + -8;
  }
  return;
}

Assistant:

static void des3_set3key( uint32_t esk[96],
                          uint32_t dsk[96],
                          const unsigned char key[24] )
{
    int i;

    mbedtls_des_setkey( esk, key );
    mbedtls_des_setkey( dsk + 32, key +  8 );
    mbedtls_des_setkey( esk + 64, key + 16 );

    for( i = 0; i < 32; i += 2 )
    {
        dsk[i     ] = esk[94 - i];
        dsk[i +  1] = esk[95 - i];

        esk[i + 32] = dsk[62 - i];
        esk[i + 33] = dsk[63 - i];

        dsk[i + 64] = esk[30 - i];
        dsk[i + 65] = esk[31 - i];
    }
}